

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i)

{
  pointer pfVar1;
  pointer pfVar2;
  int64_t iVar3;
  ulong uVar4;
  long lVar5;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x70,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  iVar3 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar3) {
    pfVar1 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = Matrix::size(&this->super_Matrix,1);
    if ((long)pfVar1 - (long)pfVar2 >> 2 != iVar3) {
      __assert_fail("x.size() == this->size(1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                    ,0x72,
                    "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
    }
    iVar3 = Matrix::size(&this->super_Matrix,1);
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = (this->super_Matrix).n_ * (ulong)(uint)i + lVar5;
        if ((ulong)((long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pfVar1 >> 2) <= uVar4) {
          __assert_fail("i * n_ + j < data_.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.h"
                        ,0x2d,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
        }
        pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar2[lVar5] = pfVar1[uVar4] + pfVar2[lVar5];
        lVar5 = lVar5 + 1;
        iVar3 = Matrix::size(&this->super_Matrix,1);
      } while (lVar5 < iVar3);
    }
    return;
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                ,0x71,"virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < this->size(1); j++) {
    x[j] += at(i, j);
  }
}